

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O0

void __thiscall
r_exec::_Mem::pack_fact_object
          (_Mem *this,Code *fact_object,Code *hlp,uint16_t *write_index,
          vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *references)

{
  vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *this_00;
  char cVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  size_type sVar8;
  reference this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 uVar9;
  undefined2 extraout_DX;
  Atom local_6c [4];
  P<r_code::Code> local_68;
  Atom local_5c [4];
  Atom local_58 [4];
  ushort local_54;
  byte local_51;
  uint16_t i_1;
  Code *pCStack_50;
  bool found;
  Code *reference;
  undefined4 local_38;
  ushort local_34;
  uint16_t local_32;
  Atom p_atom;
  uint16_t i;
  uint16_t offset;
  vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *references_local;
  uint16_t *write_index_local;
  Code *hlp_local;
  Code *fact_object_local;
  _Mem *this_local;
  
  local_32 = *write_index;
  local_34 = 0;
  _p_atom = references;
  do {
    uVar4 = (uint)local_34;
    uVar5 = (*(fact_object->super__Object)._vptr__Object[6])();
    if ((uVar5 & 0xffff) <= uVar4) {
      return;
    }
    iVar6 = (*(fact_object->super__Object)._vptr__Object[4])(fact_object,(ulong)local_34);
    local_38 = *(undefined4 *)CONCAT44(extraout_var,iVar6);
    cVar1 = r_code::Atom::getDescriptor();
    uVar9 = 0;
    if (cVar1 == -0x7c) {
      r_code::Atom::asIndex();
      r_code::Atom::IPointer((ushort)local_6c);
      iVar6 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*write_index);
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar6),local_6c);
      r_code::Atom::~Atom(local_6c);
      *write_index = *write_index + 1;
    }
    else if (cVar1 == -0x7b) {
      uVar3 = r_code::Atom::asIndex();
      iVar6 = (*(fact_object->super__Object)._vptr__Object[9])
                        (fact_object,(ulong)uVar3,extraout_DX,
                         CONCAT62((int6)((ulong)uVar9 >> 0x10),uVar3));
      pCStack_50 = (Code *)CONCAT44(extraout_var_00,iVar6);
      local_51 = 0;
      local_54 = 0;
      while( true ) {
        uVar7 = (ulong)local_54;
        sVar8 = std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::size
                          (_p_atom);
        if (sVar8 <= uVar7) break;
        this_01 = std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::
                  operator[](_p_atom,(ulong)local_54);
        bVar2 = core::P<r_code::Code>::operator==(this_01,pCStack_50);
        if (bVar2) {
          r_code::Atom::RPointer((ushort)local_58);
          iVar6 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*write_index);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar6),local_58);
          r_code::Atom::~Atom(local_58);
          local_51 = 1;
          break;
        }
        local_54 = local_54 + 1;
      }
      if ((local_51 & 1) == 0) {
        std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::size(_p_atom);
        r_code::Atom::RPointer((ushort)local_5c);
        iVar6 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*write_index);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar6),local_5c);
        r_code::Atom::~Atom(local_5c);
        this_00 = _p_atom;
        core::P<r_code::Code>::P(&local_68,pCStack_50);
        std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::push_back
                  (this_00,&local_68);
        core::P<r_code::Code>::~P(&local_68);
      }
      *write_index = *write_index + 1;
    }
    else {
      iVar6 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*write_index);
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar6),(Atom *)&local_38);
      *write_index = *write_index + 1;
    }
    r_code::Atom::~Atom((Atom *)&local_38);
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void _Mem::pack_fact_object(Code *fact_object, Code *hlp, uint16_t &write_index, std::vector<P<Code> > *references) const
{
    uint16_t offset = write_index;

    for (uint16_t i = 0; i < fact_object->code_size(); ++i) {
        Atom p_atom = fact_object->code(i);

        switch (p_atom.getDescriptor()) {
        case Atom::R_PTR: { // append this reference to the hlp's if not already there.
            Code *reference = fact_object->get_reference(p_atom.asIndex());
            bool found = false;

            for (uint16_t i = 0; i < references->size(); ++i) {
                if ((*references)[i] == reference) {
                    hlp->code(write_index) = Atom::RPointer(i);
                    found = true;
                    break;
                }
            }

            if (!found) {
                hlp->code(write_index) = Atom::RPointer(references->size());
                references->push_back(reference);
            }

            ++write_index;
            break;
        }

        case Atom::I_PTR: // offset the ptr by write_index. PB HERE.
            hlp->code(write_index) = Atom::IPointer(offset + p_atom.asIndex());
            ++write_index;
            break;

        default:
            hlp->code(write_index) = p_atom;
            ++write_index;
            break;
        }
    }
}